

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.h
# Opt level: O2

void __thiscall Parameter::print_parameters(Parameter *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"rank: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->k);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"lambda: ");
  poVar1 = std::ostream::_M_insert<double>(this->lambda);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"epsilon: ");
  poVar1 = std::ostream::_M_insert<double>(this->eps);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"max_iter: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->max_iter);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"max_inner_iter: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->max_inner_iter);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"nodes: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->num_of_machine);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"thread: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->num_of_thread);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"data_folder: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->meta_path);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"verbose: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void print_parameters(){
        cout << "rank: " << Parameter::k << endl;
        cout << "lambda: " << Parameter::lambda << endl;
        cout << "epsilon: " << Parameter::eps << endl;
        cout << "max_iter: " << Parameter::max_iter << endl;
        cout << "max_inner_iter: " << Parameter::max_inner_iter << endl;
        cout << "nodes: " << Parameter::num_of_machine << endl;
        cout << "thread: " << Parameter::num_of_thread << endl;
        cout << "data_folder: " << Parameter::meta_path << endl;
        cout << "verbose: " << Parameter::verbose << endl;
        cout << "------------------------------------" << endl;
    }